

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

uint32_t lzma_mf_find(lzma_mf *mf,uint32_t *count_ptr,lzma_match *matches)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  char *__assertion;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar3 = (*mf->find)(mf,matches);
  if (uVar3 == 0) {
    uVar6 = 0;
  }
  else {
    uVar1 = mf->nice_len;
    uVar7 = (ulong)uVar1;
    uVar8 = 0;
    while (uVar3 != uVar8) {
      if (uVar1 < matches[uVar8].len) {
        __assertion = "matches[i].len <= mf->nice_len";
        uVar6 = 0x26;
        goto LAB_0019f375;
      }
      uVar6 = mf->read_pos;
      if (uVar6 <= matches[uVar8].dist) {
        __assertion = "matches[i].dist < mf->read_pos";
        uVar6 = 0x27;
        goto LAB_0019f375;
      }
      iVar4 = bcmp(mf->buffer + ((ulong)uVar6 - 1),
                   mf->buffer + ((ulong)uVar6 - (ulong)matches[uVar8].dist) + -2,
                   (ulong)matches[uVar8].len);
      uVar8 = uVar8 + 1;
      if (iVar4 != 0) {
        __assertion = 
        "memcmp(mf_ptr(mf) - 1, mf_ptr(mf) - matches[i].dist - 2, matches[i].len) == 0";
        uVar6 = 0x2a;
LAB_0019f375:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,uVar6,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
    }
    uVar6 = matches[uVar3 - 1].len;
    if (uVar6 != uVar1) goto LAB_0019f330;
    uVar2 = mf->read_pos;
    uVar5 = (mf->write_pos - uVar2) + 1;
    if (mf->match_len_max <= uVar5) {
      uVar5 = mf->match_len_max;
    }
    uVar6 = uVar5;
    if (uVar5 < uVar1) {
      uVar6 = uVar1;
    }
    for (; uVar7 < uVar5; uVar7 = uVar7 + 1) {
      if (mf->buffer[uVar7 + ((ulong)uVar2 - 1)] !=
          mf->buffer[uVar7 + ~(ulong)matches[uVar3 - 1].dist + (ulong)uVar2 + -1]) {
        uVar6 = (uint)uVar7;
        break;
      }
    }
  }
LAB_0019f330:
  *count_ptr = uVar3;
  mf->read_ahead = mf->read_ahead + 1;
  return uVar6;
}

Assistant:

extern uint32_t
lzma_mf_find(lzma_mf *mf, uint32_t *count_ptr, lzma_match *matches)
{
	// Call the match finder. It returns the number of length-distance
	// pairs found.
	// FIXME: Minimum count is zero, what _exactly_ is the maximum?
	const uint32_t count = mf->find(mf, matches);

	// Length of the longest match; assume that no matches were found
	// and thus the maximum length is zero.
	uint32_t len_best = 0;

	if (count > 0) {
#ifndef NDEBUG
		uint32_t i;
		// Validate the matches.
		for (i = 0; i < count; ++i) {
			assert(matches[i].len <= mf->nice_len);
			assert(matches[i].dist < mf->read_pos);
			assert(memcmp(mf_ptr(mf) - 1,
				mf_ptr(mf) - matches[i].dist - 2,
				matches[i].len) == 0);
		}
#endif

		// The last used element in the array contains
		// the longest match.
		len_best = matches[count - 1].len;

		// If a match of maximum search length was found, try to
		// extend the match to maximum possible length.
		if (len_best == mf->nice_len) {
			uint8_t *p1;
			uint8_t *p2;

			// The limit for the match length is either the
			// maximum match length supported by the LZ-based
			// encoder or the number of bytes left in the
			// dictionary, whichever is smaller.
			uint32_t limit = mf_avail(mf) + 1;
			if (limit > mf->match_len_max)
				limit = mf->match_len_max;

			// Pointer to the byte we just ran through
			// the match finder.
			p1 = mf_ptr(mf) - 1;

			// Pointer to the beginning of the match. We need -1
			// here because the match distances are zero based.
			p2 = p1 - matches[count - 1].dist - 1;

			while (len_best < limit
					&& p1[len_best] == p2[len_best])
				++len_best;
		}
	}

	*count_ptr = count;

	// Finally update the read position to indicate that match finder was
	// run for this dictionary offset.
	++mf->read_ahead;

	return len_best;
}